

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O0

void example_class_import_wrap(ExampleClass *self,object *py_buffer)

{
  uchar *buf;
  size_type sVar1;
  allocator_type local_81;
  stl_input_iterator<char> local_80;
  stl_input_iterator<char> local_70;
  undefined1 local_60 [8];
  vector<char,_std::allocator<char>_> buffer;
  undefined1 local_38 [8];
  stl_input_iterator<char> end;
  stl_input_iterator<char> begin;
  object *py_buffer_local;
  ExampleClass *self_local;
  
  boost::python::stl_input_iterator<char>::stl_input_iterator
            ((stl_input_iterator<char> *)&end.impl_.ob_,py_buffer);
  boost::python::stl_input_iterator<char>::stl_input_iterator((stl_input_iterator<char> *)local_38);
  boost::python::stl_input_iterator<char>::stl_input_iterator
            (&local_70,(stl_input_iterator<char> *)&end.impl_.ob_);
  boost::python::stl_input_iterator<char>::stl_input_iterator
            (&local_80,(stl_input_iterator<char> *)local_38);
  std::allocator<char>::allocator();
  std::vector<char,std::allocator<char>>::vector<boost::python::stl_input_iterator<char>,void>
            ((vector<char,std::allocator<char>> *)local_60,&local_70,&local_80,&local_81);
  std::allocator<char>::~allocator(&local_81);
  boost::python::stl_input_iterator<char>::~stl_input_iterator(&local_80);
  boost::python::stl_input_iterator<char>::~stl_input_iterator(&local_70);
  buf = (uchar *)std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_60,0);
  sVar1 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_60);
  ExampleClass::import(self,buf,(int)sVar1);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_60)
  ;
  boost::python::stl_input_iterator<char>::~stl_input_iterator((stl_input_iterator<char> *)local_38)
  ;
  boost::python::stl_input_iterator<char>::~stl_input_iterator
            ((stl_input_iterator<char> *)&end.impl_.ob_);
  return;
}

Assistant:

void example_class_import_wrap(ExampleClass& self, boost::python::object py_buffer)
{
  namespace python = boost::python;
  python::stl_input_iterator<char> begin(py_buffer), end;
  
  // Copy the py_buffer into a local buffer with known continguous memory.
  std::vector<char> buffer(begin, end);

  // Cast and delegate to the printBuffer member function.
  self.import(reinterpret_cast<unsigned char*>(&buffer[0]), buffer.size());
}